

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# respondent.c
# Opt level: O3

int nn_respondent_send(nn_sockbase *self,nn_msg *msg)

{
  byte *pbVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  nn_msg *msg_00;
  nn_msg *self_00;
  
  if (((ulong)self[0x1b].vfptr & 1) == 0) {
    return -0x9523dfe;
  }
  msg_00 = msg;
  self_00 = msg;
  sVar4 = nn_chunkref_size(&msg->sphdr);
  if (sVar4 == 0) {
    nn_chunkref_term(&msg->sphdr);
    nn_chunkref_mv(&msg->sphdr,(nn_chunkref *)&self[0x1b].sock);
    *(byte *)&self[0x1b].vfptr = *(byte *)&self[0x1b].vfptr & 0xfe;
    uVar2 = nn_xrespondent_send(self,msg);
    self_00 = (nn_msg *)(ulong)uVar2;
    if (uVar2 == 0xfffffff5) {
      return 0;
    }
    msg_00 = msg;
    if (uVar2 == 0) {
      return 0;
    }
  }
  else {
    nn_respondent_send_cold_1();
  }
  nn_respondent_send_cold_2();
  if ((self_00[4].hdrs.u.ref[0x10] & 1) != 0) goto LAB_001273a1;
  while( true ) {
    iVar3 = nn_xrespondent_recv((nn_sockbase *)self_00,msg_00);
    if (iVar3 == 0) {
      nn_chunkref_mv((nn_chunkref *)((long)&self_00[4].hdrs.u + 0x18),&msg_00->sphdr);
      nn_chunkref_init(&msg_00->sphdr,0);
      pbVar1 = self_00[4].hdrs.u.ref + 0x10;
      *pbVar1 = *pbVar1 | 1;
      return 0;
    }
    if (iVar3 == -0xb) break;
    nn_respondent_recv_cold_1();
LAB_001273a1:
    nn_chunkref_term((nn_chunkref *)((long)&self_00[4].hdrs.u + 0x18));
    pbVar1 = self_00[4].hdrs.u.ref + 0x10;
    *pbVar1 = *pbVar1 & 0xfe;
  }
  return -0xb;
}

Assistant:

static int nn_respondent_send (struct nn_sockbase *self, struct nn_msg *msg)
{
    int rc;
    struct nn_respondent *respondent;

    respondent = nn_cont (self, struct nn_respondent, xrespondent.sockbase);

    /*  If there's no survey going on, report EFSM error. */
    if (nn_slow (!(respondent->flags & NN_RESPONDENT_INPROGRESS)))
        return -EFSM;

    /*  Tag the message with survey ID. */
    nn_assert (nn_chunkref_size (&msg->sphdr) == 0);
    nn_chunkref_term (&msg->sphdr);
    nn_chunkref_mv (&msg->sphdr, &respondent->backtrace);

    /*  Remember that no survey is being processed. */
    respondent->flags &= ~NN_RESPONDENT_INPROGRESS;

    /*  Try to send the message. If it cannot be sent due to pushback, drop it
        silently. */
    rc = nn_xrespondent_send (&respondent->xrespondent.sockbase, msg);
    errnum_assert (rc == 0 || rc == -EAGAIN, -rc);

    return 0;
}